

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Expr *p;
  Vdbe *p_00;
  ExprList *pEVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int p1;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  byte *p_01;
  Select *pSVar10;
  int *piVar11;
  CollSeq *pCVar12;
  Expr *pEVar13;
  u8 uVar14;
  Op *pOVar15;
  int *piVar16;
  ExprList_item *pEVar17;
  uint i;
  int *piVar18;
  long lVar19;
  int rRhsHasNull;
  int regToFree;
  int iDummy;
  int local_50;
  int local_4c;
  int *local_48;
  byte *local_40;
  int local_38;
  int local_34;
  
  local_4c = 0;
  p = pExpr->pLeft;
  iVar3 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar3 != 0) {
    return;
  }
  p_01 = (byte *)exprINAffinity(pParse,pExpr);
  pEVar13 = pExpr->pLeft;
  uVar14 = pEVar13->op;
  if (uVar14 == 0x9d) {
    uVar14 = pEVar13->op2;
  }
  if (uVar14 == 'w') {
    pSVar10 = (pEVar13->x).pSelect;
LAB_00235c8a:
    uVar5 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar10->pEList)->pList->nExpr;
  }
  else {
    uVar5 = 1;
    if (uVar14 == 0x9e) {
      pSVar10 = (Select *)&pEVar13->x;
      goto LAB_00235c8a;
    }
  }
  piVar11 = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar5 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_00236317;
  p_00 = pParse->pVdbe;
  piVar18 = (int *)0x0;
  piVar16 = &local_4c;
  if (destIfFalse == destIfNull) {
    piVar16 = piVar18;
  }
  local_48 = piVar11;
  local_40 = p_01;
  iVar3 = sqlite3FindInIndex(pParse,pExpr,3,piVar16,piVar11);
  pParse->iCacheLevel = pParse->iCacheLevel + 1;
  iVar4 = exprCodeVector(pParse,p,&local_34);
  if (0 < (int)uVar5) {
    piVar18 = (int *)0x0;
    do {
      if (piVar18 != (int *)(ulong)(uint)local_48[(long)piVar18]) goto LAB_00235d30;
      piVar18 = (int *)((long)piVar18 + 1);
    } while ((int *)(ulong)uVar5 != piVar18);
    piVar18 = (int *)(ulong)uVar5;
  }
LAB_00235d30:
  p1 = iVar4;
  if (((uint)piVar18 != uVar5) &&
     (p1 = sqlite3GetTempRange(pParse,uVar5), piVar11 = local_48, 0 < (int)uVar5)) {
    piVar16 = (int *)0x0;
    do {
      sqlite3VdbeAddOp3(p_00,0x40,iVar4 + (int)piVar16,piVar11[(long)piVar16] + p1,0);
      piVar16 = (int *)((long)piVar16 + 1);
    } while ((int *)(ulong)uVar5 != piVar16);
  }
  if (iVar3 == 5) {
    pEVar1 = (pExpr->x).pList;
    pCVar12 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    uVar5 = sqlite3VdbeMakeLabel(p_00);
    iVar3 = 0;
    if (destIfFalse != destIfNull) {
      if (pParse->nTempReg == '\0') {
        iVar3 = pParse->nMem + 1;
        pParse->nMem = iVar3;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar3 = pParse->aTempReg[bVar2];
      }
      sqlite3VdbeAddOp3(p_00,0x54,p1,p1,iVar3);
    }
    if (0 < pEVar1->nExpr) {
      pEVar17 = pEVar1->a;
      lVar19 = 0;
      do {
        iVar8 = sqlite3ExprCodeTemp(pParse,pEVar17->pExpr,&local_38);
        if ((iVar3 != 0) && (iVar9 = sqlite3ExprCanBeNull(pEVar17->pExpr), iVar9 != 0)) {
          sqlite3VdbeAddOp3(p_00,0x54,iVar3,iVar8,iVar3);
        }
        if ((destIfFalse == destIfNull) && ((long)pEVar1->nExpr + -1 <= lVar19)) {
          iVar8 = sqlite3VdbeAddOp3(p_00,0x4d,p1,destIfFalse,iVar8);
          sqlite3VdbeChangeP4(p_00,iVar8,(char *)pCVar12,-2);
          uVar7 = p_00->nOp;
          if (0 < (int)uVar7) {
            bVar2 = *local_40 | 0x10;
LAB_0023625e:
            p_00->aOp[(ulong)uVar7 - 1].p5 = (short)(char)bVar2;
          }
        }
        else {
          iVar8 = sqlite3VdbeAddOp3(p_00,0x4e,p1,uVar5,iVar8);
          sqlite3VdbeChangeP4(p_00,iVar8,(char *)pCVar12,-2);
          uVar7 = p_00->nOp;
          if (0 < (int)uVar7) {
            bVar2 = *local_40;
            goto LAB_0023625e;
          }
        }
        sqlite3ReleaseTempReg(pParse,local_38);
        lVar19 = lVar19 + 1;
        pEVar17 = pEVar17 + 1;
      } while (lVar19 < pEVar1->nExpr);
    }
    if (iVar3 != 0) {
      sqlite3VdbeAddOp3(p_00,0x4b,iVar3,destIfNull,0);
      sqlite3VdbeAddOp3(p_00,0xd,0,destIfFalse,0);
    }
    piVar11 = p_00->pParse->aLabel;
    if (piVar11 != (int *)0x0) {
      piVar11[(int)~uVar5] = p_00->nOp;
    }
    sqlite3ReleaseTempReg(pParse,iVar3);
  }
  else {
    uVar6 = 0;
    uVar7 = destIfFalse;
    if (destIfFalse != destIfNull) {
      uVar6 = sqlite3VdbeMakeLabel(p_00);
      uVar7 = uVar6;
    }
    if (0 < (int)uVar5) {
      i = 0;
      do {
        pEVar13 = sqlite3VectorFieldSubexpr(pExpr->pLeft,i);
        iVar8 = sqlite3ExprCanBeNull(pEVar13);
        if (iVar8 != 0) {
          sqlite3VdbeAddOp3(p_00,0x4b,i + p1,uVar7,0);
        }
        i = i + 1;
      } while (uVar5 != i);
    }
    if (iVar3 == 1) {
      sqlite3VdbeAddOp3(p_00,0x1f,pExpr->iTable,destIfFalse,p1);
      local_50 = sqlite3VdbeAddOp3(p_00,0xd,0,0,0);
    }
    else {
      iVar3 = sqlite3VdbeAddOp3(p_00,0x62,p1,uVar5,0);
      sqlite3VdbeChangeP4(p_00,iVar3,(char *)local_40,uVar5);
      if (destIfFalse == destIfNull) {
        iVar3 = sqlite3VdbeAddOp3(p_00,0x1d,pExpr->iTable,destIfFalse,p1);
        if (p_00->db->mallocFailed == '\0') {
          pOVar15 = p_00->aOp;
          pOVar15[iVar3].p4type = -3;
          pOVar15[iVar3].p4.i = uVar5;
        }
        goto LAB_002362f5;
      }
      local_50 = sqlite3VdbeAddOp3(p_00,0x1e,pExpr->iTable,0,p1);
      if (p_00->db->mallocFailed == '\0') {
        pOVar15 = p_00->aOp;
        pOVar15[local_50].p4type = -3;
        pOVar15[local_50].p4.i = uVar5;
      }
    }
    if (uVar5 == 1 && local_4c != 0) {
      sqlite3VdbeAddOp3(p_00,0x4c,local_4c,destIfFalse,0);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeAddOp3(p_00,0xd,0,destIfFalse,0);
    }
    if ((uVar6 != 0) && (piVar11 = p_00->pParse->aLabel, piVar11 != (int *)0x0)) {
      piVar11[(int)~uVar6] = p_00->nOp;
    }
    iVar3 = sqlite3VdbeAddOp3(p_00,0x25,pExpr->iTable,destIfFalse,0);
    uVar7 = destIfFalse;
    if (1 < (int)uVar5) {
      uVar7 = sqlite3VdbeMakeLabel(p_00);
    }
    if (0 < (int)uVar5) {
      uVar6 = 0;
      do {
        if (pParse->nTempReg == '\0') {
          iVar8 = pParse->nMem + 1;
          pParse->nMem = iVar8;
        }
        else {
          bVar2 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar2;
          iVar8 = pParse->aTempReg[bVar2];
        }
        pEVar13 = sqlite3VectorFieldSubexpr(p,uVar6);
        pCVar12 = sqlite3ExprCollSeq(pParse,pEVar13);
        sqlite3VdbeAddOp3(p_00,0x60,pExpr->iTable,uVar6,iVar8);
        iVar9 = sqlite3VdbeAddOp3(p_00,0x4d,p1 + uVar6,uVar7,iVar8);
        sqlite3VdbeChangeP4(p_00,iVar9,(char *)pCVar12,-2);
        sqlite3ReleaseTempReg(pParse,iVar8);
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    sqlite3VdbeAddOp3(p_00,0xd,0,destIfNull,0);
    if (1 < (int)uVar5) {
      piVar11 = p_00->pParse->aLabel;
      if (piVar11 != (int *)0x0) {
        piVar11[(int)~uVar7] = p_00->nOp;
      }
      sqlite3VdbeAddOp3(p_00,7,pExpr->iTable,iVar3 + 1,0);
      sqlite3VdbeAddOp3(p_00,0xd,0,destIfFalse,0);
    }
    if (p_00->db->mallocFailed == '\0') {
      iVar3 = p_00->nOp + -1;
      if (-1 < local_50) {
        iVar3 = local_50;
      }
      pOVar15 = p_00->aOp + iVar3;
    }
    else {
      pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar15->p2 = p_00->nOp;
  }
LAB_002362f5:
  if (p1 != iVar4) {
    sqlite3ReleaseTempReg(pParse,p1);
  }
  sqlite3ExprCachePop(pParse);
  piVar11 = local_48;
  p_01 = local_40;
LAB_00236317:
  if (piVar11 != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,piVar11);
  }
  if (p_01 != (byte *)0x0) {
    sqlite3DbFreeNN(pParse->db,p_01);
  }
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened ith cursor pExpr->iTable 
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull, aiMap);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  sqlite3ExprCachePush(pParse);
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(v);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(v);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, pExpr->iTable, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, pExpr->iTable, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, pExpr->iTable, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(v);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, pExpr->iTable, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, pExpr->iTable, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  sqlite3ExprCachePop(pParse);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}